

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

storage * __thiscall storage::read_string_abi_cxx11_(storage *this)

{
  size_t sVar1;
  void *__ptr;
  undefined8 *in_RSI;
  uint local_1c [2];
  uint32_t size;
  storage *this_local;
  string *s;
  
  local_1c[0] = 0;
  this_local = this;
  sVar1 = fread(local_1c,1,4,(FILE *)*in_RSI);
  if (sVar1 != 4) {
    __assert_fail("std::fread(&size, 1, sizeof(size), m_file) == sizeof(size)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/niXman[P]blockchain/storage.hpp"
                  ,0xdc,"std::string storage::read_string()");
  }
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::resize((ulong)this);
  __ptr = (void *)std::__cxx11::string::data();
  sVar1 = fread(__ptr,1,(ulong)local_1c[0],(FILE *)*in_RSI);
  if (sVar1 != local_1c[0]) {
    __assert_fail("std::fread(const_cast<char *>(s.data()), 1, size, m_file) == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/niXman[P]blockchain/storage.hpp"
                  ,0xdf,"std::string storage::read_string()");
  }
  return this;
}

Assistant:

std::string read_string() {
        std::uint32_t size{};
        assert(std::fread(&size, 1, sizeof(size), m_file) == sizeof(size));
        std::string s;
        s.resize(size);
        assert(std::fread(const_cast<char *>(s.data()), 1, size, m_file) == size);

        return s;
    }